

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

void __thiscall
LexerTest_ClassifyFloat_Test::~LexerTest_ClassifyFloat_Test(LexerTest_ClassifyFloat_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LexerTest, ClassifyFloat) {
  auto flt_max = "340282346638528859811704183484516925440."sv;
  EXPECT_EQ(Lexer(flt_max).takeF32(), FLT_MAX);
  EXPECT_EQ(Lexer(flt_max).takeF64(), FLT_MAX);

  auto dbl_max =
    "17976931348623157081452742373170435679807056752584499659891747"
    "68031572607800285387605895586327668781715404589535143824642343"
    "21326889464182768467546703537516986049910576551282076245490090"
    "38932894407586850845513394230458323690322294816580855933212334"
    "8274797826204144723168738177180919299881250404026184124858368"
    "."sv;
  EXPECT_EQ(Lexer(dbl_max).takeF32(), INFINITY);
  EXPECT_EQ(Lexer(dbl_max).takeF64(), DBL_MAX);

  {
    auto nan = "nan"sv;
    ASSERT_TRUE(Lexer(nan).takeF32());
    float f = *Lexer(nan).takeF32();
    EXPECT_TRUE(std::isnan(f));
    EXPECT_FALSE(std::signbit(f));
    EXPECT_EQ(payload(f), fnanDefault);

    ASSERT_TRUE(Lexer(nan).takeF64());
    double d = *Lexer(nan).takeF64();
    EXPECT_TRUE(std::isnan(d));
    EXPECT_FALSE(std::signbit(d));
    EXPECT_EQ(payload(d), dnanDefault);
  }
  {
    auto nan = "-nan"sv;
    ASSERT_TRUE(Lexer(nan).takeF32());
    float f = *Lexer(nan).takeF32();
    EXPECT_TRUE(std::isnan(f));
    EXPECT_TRUE(std::signbit(f));
    EXPECT_EQ(payload(f), fnanDefault);

    ASSERT_TRUE(Lexer(nan).takeF64());
    double d = *Lexer(nan).takeF64();
    EXPECT_TRUE(std::isnan(d));
    EXPECT_TRUE(std::signbit(d));
    EXPECT_EQ(payload(d), dnanDefault);
  }
  {
    auto nan = "+nan"sv;
    ASSERT_TRUE(Lexer(nan).takeF32());
    float f = *Lexer(nan).takeF32();
    EXPECT_TRUE(std::isnan(f));
    EXPECT_FALSE(std::signbit(f));
    EXPECT_EQ(payload(f), fnanDefault);

    ASSERT_TRUE(Lexer(nan).takeF64());
    double d = *Lexer(nan).takeF64();
    EXPECT_TRUE(std::isnan(d));
    EXPECT_FALSE(std::signbit(d));
    EXPECT_EQ(payload(d), dnanDefault);
  }
  {
    auto nan = "nan:0x1234"sv;
    ASSERT_TRUE(Lexer(nan).takeF32());
    float f = *Lexer(nan).takeF32();
    EXPECT_TRUE(std::isnan(f));
    EXPECT_FALSE(std::signbit(f));
    EXPECT_EQ(payload(f), uint32_t(0x1234));

    ASSERT_TRUE(Lexer(nan).takeF64());
    double d = *Lexer(nan).takeF64();
    EXPECT_TRUE(std::isnan(d));
    EXPECT_FALSE(std::signbit(d));
    EXPECT_EQ(payload(d), uint64_t(0x1234));
  }
  {
    auto nan = "nan:0x7FFFFF"sv;
    ASSERT_TRUE(Lexer(nan).takeF32());
    float f = *Lexer(nan).takeF32();
    EXPECT_TRUE(std::isnan(f));
    EXPECT_FALSE(std::signbit(f));
    EXPECT_EQ(payload(f), uint32_t(0x7FFFFF));

    ASSERT_TRUE(Lexer(nan).takeF64());
    double d = *Lexer(nan).takeF64();
    EXPECT_TRUE(std::isnan(d));
    EXPECT_FALSE(std::signbit(d));
    EXPECT_EQ(payload(d), uint64_t(0x7FFFFF));
  }
  {
    auto nan = "nan:0x800000"sv;
    EXPECT_FALSE(Lexer(nan).takeF32());

    ASSERT_TRUE(Lexer(nan).takeF64());
    double d = *Lexer(nan).takeF64();
    EXPECT_TRUE(std::isnan(d));
    EXPECT_FALSE(std::signbit(d));
    EXPECT_EQ(payload(d), uint64_t(0x800000));
  }

  {
    auto nan = "nan:0x0"sv;
    EXPECT_FALSE(Lexer(nan).takeF32());
    EXPECT_FALSE(Lexer(nan).takeF64());
  }
}